

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

void __thiscall
TPZAutoPointer<TPZDohrAssembly<double>_>::Release(TPZAutoPointer<TPZDohrAssembly<double>_> *this)

{
  TPZReference *this_00;
  
  if ((this->fRef != (TPZReference *)0x0) &&
     ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) {
    this_00 = this->fRef;
    if (this_00 != (TPZReference *)0x0) {
      TPZReference::~TPZReference(this_00);
    }
    operator_delete(this_00,0x10);
  }
  this->fRef = (TPZReference *)0x0;
  return;
}

Assistant:

inline void Release(){
        if(fRef && ! fRef->fCounter) {
            delete fRef;
        }
        fRef = nullptr;
    }